

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileiconprovider.cpp
# Opt level: O1

QIcon __thiscall
QAbstractFileIconProviderPrivate::getIconThemeIcon
          (QAbstractFileIconProviderPrivate *this,QFileInfo *info)

{
  char cVar1;
  IconType type;
  long in_FS_OFFSET;
  QMimeType aQStack_48 [8];
  QString local_40;
  long local_28;
  QFileInfo *pQVar2;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = info;
  cVar1 = QFileInfo::isRoot();
  type = (IconType)pQVar2;
  if (cVar1 == '\0') {
    cVar1 = QFileInfo::isDir();
    if (cVar1 == '\0') {
      QMimeDatabase::mimeTypeForFile(aQStack_48,info + 0x18);
      QMimeType::iconName();
      QIcon::fromTheme((QIcon *)this,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      QMimeType::~QMimeType(aQStack_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return (QIcon)(QIconPrivate *)this;
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) goto LAB_002689ba;
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
LAB_002689ba:
    getIconThemeIcon(this,type);
    return (QIcon)(QIconPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QIcon QAbstractFileIconProviderPrivate::getIconThemeIcon(const QFileInfo &info) const
{
    if (info.isRoot())
        return getIconThemeIcon(QAbstractFileIconProvider::Drive);
    if (info.isDir())
        return getIconThemeIcon(QAbstractFileIconProvider::Folder);
#if QT_CONFIG(mimetype)
    return QIcon::fromTheme(mimeDatabase.mimeTypeForFile(info).iconName());
#else
    return QIcon::fromTheme("text-x-generic"_L1);
#endif
}